

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPM2B_DERIVE_Unmarshal(TPM2B_DERIVE *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  uint uVar4;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar3 = 0x9a;
  if (1 < iVar1) {
    UVar2 = ByteArrayToUint16(*buffer);
    (target->t).size = UVar2;
    *buffer = *buffer + 2;
    TVar3 = 0x95;
    if ((target->t).size < 0x85) {
      TVar3 = 0x9a;
      uVar4 = (uint)(target->t).size;
      if ((int)uVar4 <= *size) {
        memcpy((target->t).buffer,*buffer,(ulong)uVar4);
        *size = *size - uVar4;
        *buffer = *buffer + uVar4;
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2B_DERIVE_Unmarshal(TPM2B_DERIVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT16_Unmarshal((UINT16 *)&(target->t.size), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->t.size) > sizeof(TPMS_DERIVE))
        return TPM_RC_SIZE;
    result = BYTE_Array_Unmarshal((BYTE *)(target->t.buffer), buffer, size, (INT32)(target->t.size));
    return result;
}